

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::load_minc2(CImg<unsigned_char> *this,char *filename)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  CImgArgumentException *this_00;
  char *pcVar6;
  char *pcVar7;
  CImg<unsigned_char> *pCVar8;
  char *filename_local;
  CImg<unsigned_char> *this_local;
  
  if (filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    uVar1 = this->_width;
    uVar2 = this->_height;
    uVar3 = this->_depth;
    uVar4 = this->_spectrum;
    puVar5 = this->_data;
    pcVar6 = "non-";
    if ((this->_is_shared & 1U) != 0) {
      pcVar6 = "";
    }
    pcVar7 = pixel_type();
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_minc2(): Specified filename is (null)."
               ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,puVar5,pcVar6,pcVar7);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  pCVar8 = load_other(this,filename);
  return pCVar8;
}

Assistant:

CImg<T>& load_minc2(const char *const filename) {
      if (!filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_minc2(): Specified filename is (null).",
                                    cimg_instance);
#ifndef cimg_use_minc2
      return load_other(filename);
#else
      minc::minc_1_reader rdr;
      rdr.open(filename);
      assign(rdr.ndim(1)?rdr.ndim(1):1,
             rdr.ndim(2)?rdr.ndim(2):1,
             rdr.ndim(3)?rdr.ndim(3):1,
             rdr.ndim(4)?rdr.ndim(4):1);
      if(typeid(T)==typeid(unsigned char))
        rdr.setup_read_byte();
      else if(typeid(T)==typeid(int))
        rdr.setup_read_int();
      else if(typeid(T)==typeid(double))
        rdr.setup_read_double();
      else
        rdr.setup_read_float();
      minc::load_standard_volume(rdr, this->_data);
      return *this;
#endif
    }